

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O0

void TestValueFunction(Arguments *args)

{
  ostream *poVar1;
  long in_RDI;
  ValueFunctionDecPOMDPDiscrete V_1;
  int i_1;
  ValueFunctionDecPOMDPDiscrete V;
  int i;
  clock_t ticks_after;
  clock_t ticks_before;
  int nrLoops;
  tms timeStruct;
  JointPolicyPureVector jpol;
  JESPExhaustivePlanner plan;
  ProblemDecTiger pu;
  int horizon;
  ProblemDecTiger *in_stack_fffffffffffff7e0;
  Interface_ProblemToPolicyDiscretePure *in_stack_fffffffffffff808;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffff810;
  DecPOMDPDiscreteInterface *local_798;
  ValueFunctionDecPOMDPDiscrete local_790 [124];
  int local_714;
  ValueFunctionDecPOMDPDiscrete local_710 [124];
  int local_694;
  long local_690;
  clock_t local_688;
  int local_67c;
  tms local_678;
  JointPolicyDiscretePure local_658 [168];
  JESPExhaustivePlanner local_5b0 [848];
  ProblemDecTiger local_260;
  int local_c;
  long local_8;
  
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"TestValueFunction()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_c = 4;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"horizon=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ProblemDecTiger::ProblemDecTiger(&local_260);
  local_798 = (DecPOMDPDiscreteInterface *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x260) {
    local_798 = (DecPOMDPDiscreteInterface *)
                (&local_260.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                  super_MultiAgentDecisionProcess.field_0x0 +
                *(long *)(local_260.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                          super_MultiAgentDecisionProcess._0_8_ + -0x50));
  }
  JESPExhaustivePlanner::JESPExhaustivePlanner
            (local_5b0,(long)local_c,local_798,(PlanningUnitMADPDiscreteParameters *)0x0);
  PlanningUnitDecPOMDPDiscrete::SetProblem((DecPOMDPDiscreteInterface *)local_5b0);
  MultiAgentDecisionProcessDiscrete::Print(in_stack_fffffffffffff810);
  PlanningUnitMADPDiscrete::Print();
  JointPolicyPureVector::JointPolicyPureVector
            ((JointPolicyPureVector *)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  local_67c = 1000;
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Press <enter> to start value (v0) calculation of ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_67c);
    poVar1 = std::operator<<(poVar1," joint policies without caching.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::istream::get();
  }
  local_688 = times(&local_678);
  for (local_694 = 0; local_694 < local_67c; local_694 = local_694 + 1) {
    JointPolicyPureVector::RandomInitialization((JointPolicyPureVector *)0x11fd85);
    ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
              (local_710,(PlanningUnitDecPOMDPDiscrete *)local_5b0,local_658);
    ValueFunctionDecPOMDPDiscrete::CalculateV<false>();
    ValueFunctionDecPOMDPDiscrete::~ValueFunctionDecPOMDPDiscrete(local_710);
  }
  local_690 = times(&local_678);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"done in ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_690 - local_688);
    poVar1 = std::operator<<(poVar1," clock ticks.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Now starting value (v0) calculation of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_67c);
  poVar1 = std::operator<<(poVar1," joint policies with caching.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_688 = times(&local_678);
  for (local_714 = 0; local_714 < local_67c; local_714 = local_714 + 1) {
    JointPolicyPureVector::RandomInitialization((JointPolicyPureVector *)0x11ff27);
    ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
              (local_790,(PlanningUnitDecPOMDPDiscrete *)local_5b0,local_658);
    ValueFunctionDecPOMDPDiscrete::CalculateV<true>();
    ValueFunctionDecPOMDPDiscrete::~ValueFunctionDecPOMDPDiscrete(local_790);
  }
  local_690 = times(&local_678);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"done in ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_690 - local_688);
    poVar1 = std::operator<<(poVar1," clock ticks.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    in_stack_fffffffffffff7e0 =
         (ProblemDecTiger *)std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffff7e0,std::endl<char,std::char_traits<char>>);
    std::istream::get();
  }
  JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)in_stack_fffffffffffff7e0);
  JESPExhaustivePlanner::~JESPExhaustivePlanner((JESPExhaustivePlanner *)in_stack_fffffffffffff7e0);
  ProblemDecTiger::~ProblemDecTiger(in_stack_fffffffffffff7e0);
  return;
}

Assistant:

void TestValueFunction(const ArgumentHandlers::Arguments& args)
{
    cout << "-------------------"<<endl;
    cout << "TestValueFunction()"<<endl;
    cout << "-------------------"<<endl;
    int horizon = 4;
    cout << endl << "horizon="<< horizon <<endl;
    ProblemDecTiger pu;
    JESPExhaustivePlanner plan(horizon, &pu);
    plan.SetProblem(&pu);

    pu.Print();
    plan.Print();

    JointPolicyPureVector jpol(&plan);
    
    //ValueFunctionDecPOMDPDiscrete Vtest(plan, jpol);
    //Vtest.Test();

    //the time structure...
    tms timeStruct;
    

    int nrLoops = 1000;
    if (!args.testMode)
    {
        cout << endl <<"Press <enter> to start value (v0) calculation of "<<nrLoops
             <<" joint policies without caching."<<endl;
        cin.get();
    }

    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
    for(int i=0; i < nrLoops; i++)
    {
        jpol.RandomInitialization();
        ValueFunctionDecPOMDPDiscrete V(plan, jpol);
        /*double val =*/ V.CalculateV<false>();
    }
    ticks_after = times(&timeStruct);
    if (!args.testMode)
        cout << "done in "<< ticks_after - ticks_before << " clock ticks."<<endl;
    cout << "Now starting value (v0) calculation of "<<nrLoops<<
        " joint policies with caching."<<endl;
    ticks_before = times(&timeStruct);
    for(int i=0; i < nrLoops; i++)
    {
        jpol.RandomInitialization();
        ValueFunctionDecPOMDPDiscrete V(plan, jpol);
        /*double val =*/ V.CalculateV<true>();
    }    
    ticks_after = times(&timeStruct);
    if (!args.testMode)
        cout << "done in "<< ticks_after - ticks_before << " clock ticks."<<endl;

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
    
}